

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void do_split(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *pCVar5;
  char *txt;
  uint uVar6;
  CHAR_DATA *pCVar7;
  char buf [4608];
  char arg1 [4608];
  char acStack_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_1238);
  if (local_1238[0] == '\0') {
    txt = "Split how much?\n\r";
  }
  else {
    uVar3 = atoi(local_1238);
    if ((int)uVar3 < 0) {
      txt = "Your group wouldn\'t like that.\n\r";
    }
    else if (uVar3 == 0) {
      txt = "You hand out zero coins, but no one notices.\n\r";
    }
    else if (ch->gold < (long)(ulong)uVar3) {
      txt = "You don\'t have that much to split.\n\r";
    }
    else {
      pCVar7 = ch->in_room->people;
      if (pCVar7 != (CHAR_DATA *)0x0) {
        uVar6 = 0;
        do {
          pCVar4 = pCVar7->leader;
          if (pCVar7->leader == (CHAR_DATA *)0x0) {
            pCVar4 = pCVar7;
          }
          pCVar5 = ch->leader;
          if (ch->leader == (CHAR_DATA *)0x0) {
            pCVar5 = ch;
          }
          if (pCVar4 == pCVar5) {
            bVar2 = is_affected_by(pCVar7,0x12);
            uVar6 = uVar6 + !bVar2;
          }
          pCVar7 = pCVar7->next_in_room;
        } while (pCVar7 != (CHAR_DATA *)0x0);
        if (1 < (int)uVar6) {
          uVar1 = (ulong)uVar3 / (ulong)uVar6;
          if (uVar6 <= uVar3) {
            ch->gold = (ch->gold - (ulong)uVar3) + (ulong)(uVar3 % uVar6 + (int)uVar1);
            sprintf(acStack_2438,"You split %d gold coins. Your share is %d gold.\n\r",(ulong)uVar3)
            ;
            send_to_char(acStack_2438,ch);
            sprintf(acStack_2438,"$n splits %d gold coins. Your share is %d gold.",(ulong)uVar3,
                    uVar1);
            for (pCVar7 = ch->in_room->people; pCVar7 != (CHAR_DATA *)0x0;
                pCVar7 = pCVar7->next_in_room) {
              if (pCVar7 != ch) {
                pCVar4 = pCVar7->leader;
                if (pCVar7->leader == (CHAR_DATA *)0x0) {
                  pCVar4 = pCVar7;
                }
                pCVar5 = ch->leader;
                if (ch->leader == (CHAR_DATA *)0x0) {
                  pCVar5 = ch;
                }
                if ((pCVar4 == pCVar5) && (bVar2 = is_affected_by(pCVar7,0x12), !bVar2)) {
                  act(acStack_2438,ch,(void *)0x0,pCVar7,2);
                  pCVar7->gold = pCVar7->gold + uVar1;
                }
              }
            }
            return;
          }
          txt = "Don\'t even bother, cheapskate.\n\r";
          goto LAB_0023f288;
        }
      }
      txt = "Just keep it all.\n\r";
    }
  }
LAB_0023f288:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_split(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Split how much?\n\r", ch);
		return;
	}

	auto amount_gold = atoi(arg1);
	if (amount_gold < 0)
	{
		send_to_char("Your group wouldn't like that.\n\r", ch);
		return;
	}

	if (amount_gold == 0)
	{
		send_to_char("You hand out zero coins, but no one notices.\n\r", ch);
		return;
	}

	if (ch->gold < amount_gold)
	{
		send_to_char("You don't have that much to split.\n\r", ch);
		return;
	}

	auto members = 0;
	for (auto gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(gch, ch) && !is_affected_by(gch, AFF_CHARM))
			members++;
	}

	if (members < 2)
	{
		send_to_char("Just keep it all.\n\r", ch);
		return;
	}

	auto share_gold = amount_gold / members;
	auto extra_gold = amount_gold % members;

	if (share_gold == 0)
	{
		send_to_char("Don't even bother, cheapskate.\n\r", ch);
		return;
	}

	ch->gold -= amount_gold;
	ch->gold += share_gold + extra_gold;

	char buf[MAX_STRING_LENGTH];
	if (share_gold > 0)
	{
		sprintf(buf, "You split %d gold coins. Your share is %d gold.\n\r", amount_gold, share_gold + extra_gold);
		send_to_char(buf, ch);
	}

	sprintf(buf, "$n splits %d gold coins. Your share is %d gold.", amount_gold, share_gold);

	for (auto gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (gch != ch && is_same_group(gch, ch) && !is_affected_by(gch, AFF_CHARM))
		{
			act(buf, ch, nullptr, gch, TO_VICT);
			gch->gold += share_gold;
		}
	}
}